

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_67a2b::StateBlockBuilder::activate(StateBlockBuilder *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_AppState).m_completed = false;
  this_00 = (this->m_nextState).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->m_nextState).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_nextState).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return true;
}

Assistant:

virtual bool activate() override
    {
        m_completed = false;
        m_nextState = {};
        return true;
    }